

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O2

void secp256k1_fe_mul_int(secp256k1_fe *r,int a)

{
  ulong uVar1;
  
  uVar1 = (ulong)(uint)a;
  r->n[0] = r->n[0] * uVar1;
  r->n[1] = r->n[1] * uVar1;
  r->n[2] = r->n[2] * uVar1;
  r->n[3] = r->n[3] * uVar1;
  r->n[4] = uVar1 * r->n[4];
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_mul_int(secp256k1_fe *r, int a) {
    r->n[0] *= a;
    r->n[1] *= a;
    r->n[2] *= a;
    r->n[3] *= a;
    r->n[4] *= a;
#ifdef VERIFY
    r->magnitude *= a;
    r->normalized = 0;
    secp256k1_fe_verify(r);
#endif
}